

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Status __thiscall
leveldb::Version::Get(Version *this,ReadOptions *options,LookupKey *k,string *value,GetStats *stats)

{
  undefined8 *in_R9;
  Slice user_key;
  Slice internal_key;
  Slice local_a8;
  Slice local_98;
  undefined4 local_88 [2];
  undefined8 local_80;
  char *local_78;
  size_t local_70;
  GetStats *local_68;
  LookupKey *local_58;
  char *local_50;
  size_t local_48;
  undefined8 local_40;
  undefined4 local_38;
  long local_30;
  Status local_28;
  char local_20;
  
  *in_R9 = 0;
  *(undefined4 *)(in_R9 + 1) = 0xffffffff;
  local_28.state_ = (char *)0x0;
  local_20 = '\0';
  local_40 = 0;
  local_38 = 0xffffffff;
  local_78 = (char *)value->_M_string_length;
  local_48 = (value->field_2)._M_allocated_capacity - (long)local_78;
  local_30 = *(long *)options;
  local_88[0] = 0;
  local_80 = *(undefined8 *)(local_30 + 0x40);
  local_70 = local_48 - 8;
  user_key.size_ = local_70;
  user_key.data_ = local_78;
  internal_key.size_ = local_48;
  internal_key.data_ = local_78;
  local_68 = stats;
  local_58 = k;
  local_50 = local_78;
  ForEachOverlapping((Version *)options,user_key,internal_key,local_88,
                     Get(leveldb::ReadOptions_const&,leveldb::LookupKey_const&,std::__cxx11::
                     string*,leveldb::Version::GetStats*)::State::Match(void*,int,leveldb::
                     FileMetaData__);
  if (local_20 == '\x01') {
    Status::Status((Status *)this,&local_28);
  }
  else {
    local_98.data_ = "";
    local_98.size_ = 0;
    local_a8.data_ = "";
    local_a8.size_ = 0;
    Status::NotFound((Status *)this,&local_98,&local_a8);
  }
  Status::~Status(&local_28);
  return (Status)(char *)this;
}

Assistant:

Status Version::Get(const ReadOptions& options, const LookupKey& k,
                    std::string* value, GetStats* stats) {
  stats->seek_file = nullptr;
  stats->seek_file_level = -1;

  struct State {
    Saver saver;
    GetStats* stats;
    const ReadOptions* options;
    Slice ikey;
    FileMetaData* last_file_read;
    int last_file_read_level;

    VersionSet* vset;
    Status s;
    bool found;

    static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);

      if (state->stats->seek_file == nullptr &&
          state->last_file_read != nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        state->stats->seek_file = state->last_file_read;
        state->stats->seek_file_level = state->last_file_read_level;
      }

      state->last_file_read = f;
      state->last_file_read_level = level;

      state->s = state->vset->table_cache_->Get(*state->options, f->number,
                                                f->file_size, state->ikey,
                                                &state->saver, SaveValue);
      if (!state->s.ok()) {
        state->found = true;
        return false;
      }
      switch (state->saver.state) {
        case kNotFound:
          return true;  // Keep searching in other files
        case kFound:
          state->found = true;
          return false;
        case kDeleted:
          return false;
        case kCorrupt:
          state->s =
              Status::Corruption("corrupted key for ", state->saver.user_key);
          state->found = true;
          return false;
      }

      // Not reached. Added to avoid false compilation warnings of
      // "control reaches end of non-void function".
      return false;
    }
  };

  State state;
  state.found = false;
  state.stats = stats;
  state.last_file_read = nullptr;
  state.last_file_read_level = -1;

  state.options = &options;
  state.ikey = k.internal_key();
  state.vset = vset_;

  state.saver.state = kNotFound;
  state.saver.ucmp = vset_->icmp_.user_comparator();
  state.saver.user_key = k.user_key();
  state.saver.value = value;

  ForEachOverlapping(state.saver.user_key, state.ikey, &state, &State::Match);

  return state.found ? state.s : Status::NotFound(Slice());
}